

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void vmaFreeMemoryPages(VmaAllocator allocator,size_t allocationCount,VmaAllocation *pAllocations)

{
  long in_RSI;
  VmaAllocation *in_stack_00000020;
  size_t in_stack_00000028;
  VmaAllocator_T *in_stack_00000030;
  
  if (in_RSI != 0) {
    VmaAllocator_T::FreeMemory(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaFreeMemoryPages(
    VmaAllocator allocator,
    size_t allocationCount,
    const VmaAllocation* pAllocations)
{
    if(allocationCount == 0)
    {
        return;
    }

    VMA_ASSERT(allocator);

    VMA_DEBUG_LOG("vmaFreeMemoryPages");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    allocator->FreeMemory(allocationCount, pAllocations);
}